

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileSimpleString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  char cVar1;
  uint nKeyLen;
  SyToken *pSVar2;
  jx9_vm *pjVar3;
  SyHashEntry_Pr *pSVar4;
  jx9_value *pObj;
  sxu32 sVar5;
  char *pcVar6;
  char *pcVar7;
  sxi32 sVar8;
  char *pcVar9;
  sxu32 local_3c;
  SyToken *local_38;
  
  pSVar2 = pGen->pIn;
  local_3c = 0;
  pcVar6 = (pSVar2->sData).zString;
  nKeyLen = (pSVar2->sData).nByte;
  if ((((ulong)nKeyLen != 0) && ((pGen->hLiteral).nEntry != 0)) &&
     (pSVar4 = HashGetEntry(&pGen->hLiteral,pcVar6,nKeyLen), pSVar4 != (SyHashEntry_Pr *)0x0)) {
    jx9VmEmitInstr(pGen->pVm,4,0,*(sxu32 *)&pSVar4->pUserData,(void *)0x0,(sxu32 *)0x0);
    return 0;
  }
  pObj = jx9VmReserveConstObj(pGen->pVm,&local_3c);
  if (pObj == (jx9_value *)0x0) {
    jx9GenCompileError(pGen,1,1,"JX9 engine is running out of memory");
    sVar8 = -10;
  }
  else {
    pjVar3 = pGen->pVm;
    pObj->pVm = (jx9_vm *)0x0;
    (pObj->sBlob).pAllocator = (SyMemBackend *)0x0;
    (pObj->x).rVal = 0.0;
    *(undefined8 *)&pObj->iFlags = 0;
    *(undefined8 *)&(pObj->sBlob).nFlags = 0;
    *(undefined8 *)&pObj->nIdx = 0;
    (pObj->sBlob).pBlob = (void *)0x0;
    (pObj->sBlob).nByte = 0;
    (pObj->sBlob).mByte = 0;
    pObj->pVm = pjVar3;
    (pObj->sBlob).pAllocator = &pjVar3->sAllocator;
    pObj->iFlags = 1;
    local_38 = pSVar2;
    if (nKeyLen != 0) {
      pcVar9 = pcVar6 + nKeyLen;
      pcVar7 = pcVar6;
LAB_00129fed:
      do {
        if (*pcVar7 != '\\') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 < pcVar9) goto LAB_00129fed;
        }
        if (pcVar6 < pcVar7) {
          sVar5 = (int)pcVar7 - (int)pcVar6;
        }
        else {
          pcVar6 = "";
          sVar5 = 0;
        }
        jx9MemObjStringAppend(pObj,pcVar6,sVar5);
        if (pcVar7 + 1 < pcVar9) {
          cVar1 = pcVar7[1];
          if (cVar1 == '\'') {
            pcVar6 = "\'";
LAB_0012a044:
            sVar5 = 1;
          }
          else {
            if (cVar1 == '\\') {
              pcVar6 = "\\";
              goto LAB_0012a044;
            }
            sVar5 = 2;
            pcVar6 = pcVar7;
          }
          jx9MemObjStringAppend(pObj,pcVar6,sVar5);
        }
        pcVar6 = pcVar7 + 2;
        pcVar7 = pcVar6;
      } while (pcVar6 < pcVar9);
    }
    sVar8 = 0;
    jx9VmEmitInstr(pGen->pVm,4,0,local_3c,(void *)0x0,(sxu32 *)0x0);
    if (((local_38->sData).nByte < 0x400) && (sVar5 = (pObj->sBlob).nByte, sVar5 != 0)) {
      SyHashInsert(&pGen->hLiteral,(pObj->sBlob).pBlob,sVar5,(void *)(ulong)local_3c);
    }
  }
  return sVar8;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileSimpleString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	const char *zIn, *zCur, *zEnd;
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	/* Delimit the string */
	zIn  = pStr->zString;
	zEnd = &zIn[pStr->nByte];
	if( zIn > zEnd ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	if( SXRET_OK == GenStateFindLiteral(&(*pGen), pStr, &nIdx) ){
		/* Already processed, emit the load constant instruction
		 * and return.
		 */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, 1, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	jx9MemObjInitFromString(pGen->pVm, pObj, 0);
	/* Compile the node */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append raw contents*/
			jx9MemObjStringAppend(pObj, zCur, (sxu32)(zIn-zCur));
		}
		else
		{
			jx9MemObjStringAppend(pObj, "", 0);
		}
		zIn++;
		if( zIn < zEnd ){
			if( zIn[0] == '\\' ){
				/* A literal backslash */
				jx9MemObjStringAppend(pObj, "\\", sizeof(char));
			}else if( zIn[0] == '\'' ){
				/* A single quote */
				jx9MemObjStringAppend(pObj, "'", sizeof(char));
			}else{
				/* verbatim copy */
				zIn--;
				jx9MemObjStringAppend(pObj, zIn, sizeof(char)*2);
				zIn++;
			}
		}
		/* Advance the stream cursor */
		zIn++;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	if( pStr->nByte < 1024 ){
		/* Install in the literal table */
		GenStateInstallLiteral(pGen, pObj, nIdx);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}